

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_key
          (serializer<toml::type_config> *this,key_type *key)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  long in_RSI;
  string_type *in_RDI;
  int c2;
  int c1;
  char_type c;
  const_iterator __end0;
  const_iterator __begin0;
  key_type *__range3;
  region reg;
  location loc;
  string_type *formatted;
  undefined7 in_stack_fffffffffffffd28;
  char in_stack_fffffffffffffd2f;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffdd8;
  spec *in_stack_fffffffffffffdf8;
  location *in_stack_fffffffffffffeb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [4];
  
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x697c76);
  if (bVar2) {
    string_conv<std::__cxx11::string,3ul>
              ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd68);
    this_00 = local_80;
    make_temporary_location(in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    syntax::unquoted_key(in_stack_fffffffffffffdf8);
    repeat_at_least::scan
              ((repeat_at_least *)in_stack_fffffffffffffeb8._M_current,in_stack_fffffffffffffeb0);
    repeat_at_least::~repeat_at_least
              ((repeat_at_least *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    bVar2 = region::is_ok((region *)0x697d3e);
    if ((bVar2) &&
       (bVar2 = location::eof((location *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30)), bVar2)
       ) {
      std::__cxx11::string::string(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    else {
      string_conv<std::__cxx11::string,2ul>
                ((char (*) [2])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                (this_00);
      while (bVar2 = __gnu_cxx::
                     operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28)),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&stack0xfffffffffffffeb8);
        cVar1 = *pcVar3;
        in_stack_fffffffffffffd34 = (int)cVar1;
        if (in_stack_fffffffffffffd34 == 8) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if (in_stack_fffffffffffffd34 == 9) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if (in_stack_fffffffffffffd34 == 10) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if (in_stack_fffffffffffffd34 == 0xc) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if (in_stack_fffffffffffffd34 == 0xd) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if (in_stack_fffffffffffffd34 == 0x22) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if (in_stack_fffffffffffffd34 == 0x5c) {
          string_conv<std::__cxx11::string,3ul>
                    ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
        }
        else if ((((cVar1 < '\0') || ('\b' < cVar1)) && ((cVar1 < '\n' || ('\x1f' < cVar1)))) &&
                (cVar1 != '\x7f')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd2f);
        }
        else {
          if ((*(byte *)(in_RSI + 0x11) & 1) == 0) {
            string_conv<std::__cxx11::string,5ul>
                      ((char (*) [5])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          }
          else {
            string_conv<std::__cxx11::string,3ul>
                      ((char (*) [3])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd2f);
          if ((int)cVar1 % 0x10 < 10) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       in_stack_fffffffffffffd2f);
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       in_stack_fffffffffffffd2f);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xfffffffffffffeb8);
      }
      string_conv<std::__cxx11::string,2ul>
                ((char (*) [2])CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    }
    region::~region((region *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    location::~location((location *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  }
  return in_RDI;
}

Assistant:

string_type format_key(const key_type& key) // {{{
    {
        if(key.empty())
        {
            return string_conv<string_type>("\"\"");
        }

        // check the key can be a bare (unquoted) key
        auto loc = detail::make_temporary_location(string_conv<std::string>(key));
        auto reg = detail::syntax::unquoted_key(this->spec_).scan(loc);
        if(reg.is_ok() && loc.eof())
        {
            return key;
        }

        //if it includes special characters, then format it in a "quoted" key.
        string_type formatted = string_conv<string_type>("\"");
        for(const char_type c : key)
        {
            switch(c)
            {
                case char_type('\\'): {formatted += string_conv<string_type>("\\\\"); break;}
                case char_type('\"'): {formatted += string_conv<string_type>("\\\""); break;}
                case char_type('\b'): {formatted += string_conv<string_type>("\\b" ); break;}
                case char_type('\t'): {formatted += string_conv<string_type>("\\t" ); break;}
                case char_type('\f'): {formatted += string_conv<string_type>("\\f" ); break;}
                case char_type('\n'): {formatted += string_conv<string_type>("\\n" ); break;}
                case char_type('\r'): {formatted += string_conv<string_type>("\\r" ); break;}
                default  :
                {
                    // ASCII ctrl char
                    if( (char_type(0x00) <= c && c <= char_type(0x08)) ||
                        (char_type(0x0A) <= c && c <= char_type(0x1F)) ||
                        c == char_type(0x7F))
                    {
                        if(spec_.v1_1_0_add_escape_sequence_x)
                        {
                            formatted += string_conv<string_type>("\\x");
                        }
                        else
                        {
                            formatted += string_conv<string_type>("\\u00");
                        }
                        const auto c1 = c / 16;
                        const auto c2 = c % 16;
                        formatted += static_cast<char_type>('0' + c1);
                        if(c2 < 10)
                        {
                            formatted += static_cast<char_type>('0' + c2);
                        }
                        else // 10 <= c2
                        {
                            formatted += static_cast<char_type>('A' + (c2 - 10));
                        }
                    }
                    else
                    {
                        formatted += c;
                    }
                    break;
                }
            }
        }
        formatted += string_conv<string_type>("\"");
        return formatted;
    }